

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O2

Gia_Man_t * Acb_NtkToGia2(Acb_Ntk_t *p,int fUseBuf,int fUseXors,Vec_Int_t *vTargets,int nTargets)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Gia_Man_t *p_00;
  char *pcVar4;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  int *piVar5;
  Gia_Man_t *pGVar6;
  int iVar7;
  bool bVar8;
  
  p_00 = Gia_ManStart((p->vObjType).nSize * 2 + 0x3e6);
  pcVar4 = Acb_NtkStr(p,p->NameId);
  pcVar4 = Abc_UtilStrsav(pcVar4);
  p_00->pName = pcVar4;
  Vec_IntFill(&p->vObjCopy,(p->vObjType).nCap,-1);
  for (iVar7 = 0; iVar7 < (p->vCis).nSize; iVar7 = iVar7 + 1) {
    iVar1 = Vec_IntEntry(&p->vCis,iVar7);
    iVar2 = Gia_ManAppendCi(p_00);
    Acb_ObjSetCopy(p,iVar1,iVar2);
  }
  iVar7 = 0;
  if (vTargets == (Vec_Int_t *)0x0) {
    iVar7 = 0;
    if (0 < nTargets) {
      iVar7 = nTargets;
    }
    while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
      Gia_ManAppendCi(p_00);
    }
  }
  else {
    for (; iVar7 < vTargets->nSize; iVar7 = iVar7 + 1) {
      iVar1 = Vec_IntEntry(vTargets,iVar7);
      iVar2 = Gia_ManAppendCi(p_00);
      Acb_ObjSetCopy(p,iVar1,iVar2);
    }
  }
  p_01 = Vec_IntAlloc(4);
  p_02 = Acb_NtkFindNodes2(p);
  iVar7 = p_02->nSize;
  iVar1 = 0;
  if (iVar7 < 1) {
    iVar7 = 0;
  }
  for (; iVar7 != iVar1; iVar1 = iVar1 + 1) {
    iVar2 = Vec_IntEntry(p_02,iVar1);
    iVar3 = Acb_ObjCopy(p,iVar2);
    if (iVar3 == -1) {
      iVar3 = Acb_ObjToGia2(p_00,fUseBuf,p,iVar2,p_01,fUseXors);
      Acb_ObjSetCopy(p,iVar2,iVar3);
    }
  }
  Vec_IntFree(p_02);
  Vec_IntFree(p_01);
  for (iVar7 = 0; iVar7 < (p->vCos).nSize; iVar7 = iVar7 + 1) {
    iVar1 = Vec_IntEntry(&p->vCos,iVar7);
    piVar5 = Acb_ObjFanins(p,iVar1);
    iVar1 = Acb_ObjCopy(p,piVar5[1]);
    Gia_ManAppendCo(p_00,iVar1);
  }
  pGVar6 = Gia_ManCleanup(p_00);
  Gia_ManUpdateCopy(&p->vObjCopy,p_00);
  Gia_ManStop(p_00);
  return pGVar6;
}

Assistant:

Gia_Man_t * Acb_NtkToGia2( Acb_Ntk_t * p, int fUseBuf, int fUseXors, Vec_Int_t * vTargets, int nTargets )
{
    Gia_Man_t * pNew, * pOne;
    Vec_Int_t * vFanins, * vNodes;
    int i, iObj;
    pNew = Gia_ManStart( 2 * Acb_NtkObjNum(p) + 1000 );
    pNew->pName = Abc_UtilStrsav(Acb_NtkName(p));
    Acb_NtkCleanObjCopies( p );
    Acb_NtkForEachCi( p, iObj, i )
        Acb_ObjSetCopy( p, iObj, Gia_ManAppendCi(pNew) );
    if ( vTargets )
        Vec_IntForEachEntry( vTargets, iObj, i )
            Acb_ObjSetCopy( p, iObj, Gia_ManAppendCi(pNew) );
    else
        for ( i = 0; i < nTargets; i++ )
            Gia_ManAppendCi(pNew);
    vFanins = Vec_IntAlloc( 4 );
    vNodes  = Acb_NtkFindNodes2( p );
    Vec_IntForEachEntry( vNodes, iObj, i )
        if ( Acb_ObjCopy(p, iObj) == -1 ) // skip targets assigned above
            Acb_ObjSetCopy( p, iObj, Acb_ObjToGia2(pNew, fUseBuf, p, iObj, vFanins, fUseXors) );
    Vec_IntFree( vNodes );
    Vec_IntFree( vFanins );
    Acb_NtkForEachCo( p, iObj, i )
        Gia_ManAppendCo( pNew, Acb_ObjCopy(p, Acb_ObjFanin(p, iObj, 0)) );
    pNew = Gia_ManCleanup( pOne = pNew );
    Gia_ManUpdateCopy( &p->vObjCopy, pOne );
    Gia_ManStop( pOne );
    return pNew;
}